

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O3

float64 propagateFloat64NaN(float64 a,float64 b,float_status *status)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  
  if ((a & 0x7fffffffffffffff) < 0x7ff0000000000001) {
    bVar4 = 2;
    if ((b & 0x7fffffffffffffff) < 0x7ff0000000000001) {
      bVar7 = false;
      bVar1 = false;
    }
    else {
LAB_00cf69f6:
      bVar5 = (b & 0x7ff8000000000000) == 0x7ff0000000000000;
      bVar6 = (b & 0x7ffffffffffff) != 0;
      bVar7 = bVar4 == 5;
      bVar1 = !bVar7 || bVar6 && bVar5;
      if ((bVar6 && bVar5) || (bVar4 == 5)) goto LAB_00cf6a3c;
LAB_00cf6a45:
      bVar1 = false;
      bVar7 = false;
    }
  }
  else {
    bVar7 = (a & 0x7ff8000000000000) == 0x7ff0000000000000;
    bVar5 = (a & 0x7ffffffffffff) != 0;
    if (0x7ff0000000000000 < (b & 0x7fffffffffffffff)) {
      bVar4 = (bVar5 && bVar7) | 4;
      goto LAB_00cf69f6;
    }
    bVar1 = false;
    if (!bVar5 || !bVar7) {
      bVar4 = 4;
      goto LAB_00cf6a45;
    }
    bVar7 = true;
    bVar4 = 5;
LAB_00cf6a3c:
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  if (status->default_nan_mode != '\0') {
    return 0x7ff8000000000000;
  }
  uVar3 = a * 2;
  uVar2 = b * 2;
  if (bVar4 == 5) {
    bVar5 = bVar1 == true;
    if (bVar1 == true) {
      bVar5 = uVar3 < uVar2 || b <= a && uVar3 <= uVar2;
    }
    if (!bVar5) goto LAB_00cf6aab;
  }
  else if ((bVar4 == 4) && (bVar1 != true || uVar3 >= uVar2 && (b > a || uVar3 > uVar2))) {
LAB_00cf6aab:
    if (bVar7) {
      return a | 0x8000000000000;
    }
    return a;
  }
  uVar3 = b | 0x8000000000000;
  if (bVar1 != true) {
    uVar3 = b;
  }
  return uVar3;
}

Assistant:

static float64 propagateFloat64NaN(float64 a, float64 b, float_status *status)
{
    flag aIsLargerSignificand;
    uint64_t av, bv;
    FloatClass a_cls, b_cls;

    /* This is not complete, but is good enough for pickNaN.  */
    a_cls = (!float64_is_any_nan(a)
             ? float_class_normal
             : float64_is_signaling_nan(a, status)
             ? float_class_snan
             : float_class_qnan);
    b_cls = (!float64_is_any_nan(b)
             ? float_class_normal
             : float64_is_signaling_nan(b, status)
             ? float_class_snan
             : float_class_qnan);

    av = float64_val(a);
    bv = float64_val(b);

    if (is_snan(a_cls) || is_snan(b_cls)) {
        float_raise(float_flag_invalid, status);
    }

    if (status->default_nan_mode) {
        return float64_default_nan(status);
    }

    if ((uint64_t)(av << 1) < (uint64_t)(bv << 1)) {
        aIsLargerSignificand = 0;
    } else if ((uint64_t)(bv << 1) < (uint64_t)(av << 1)) {
        aIsLargerSignificand = 1;
    } else {
        aIsLargerSignificand = (av < bv) ? 1 : 0;
    }

    if (pickNaN(a_cls, b_cls, aIsLargerSignificand)) {
        if (is_snan(b_cls)) {
            return float64_silence_nan(b, status);
        }
        return b;
    } else {
        if (is_snan(a_cls)) {
            return float64_silence_nan(a, status);
        }
        return a;
    }
}